

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

Uint32 anon_unknown.dwarf_1f658a::RenderTargetImpl::factorToGlConstant(Factor blendFactor)

{
  ostream *poVar1;
  undefined4 in_EDI;
  Uint32 local_4;
  
  switch(in_EDI) {
  case 0:
    local_4 = 0;
    break;
  case 1:
    local_4 = 1;
    break;
  case 2:
    local_4 = 0x300;
    break;
  case 3:
    local_4 = 0x301;
    break;
  case 4:
    local_4 = 0x306;
    break;
  case 5:
    local_4 = 0x307;
    break;
  case 6:
    local_4 = 0x302;
    break;
  case 7:
    local_4 = 0x303;
    break;
  case 8:
    local_4 = 0x304;
    break;
  case 9:
    local_4 = 0x305;
    break;
  default:
    poVar1 = sf::err();
    poVar1 = std::operator<<(poVar1,
                             "Invalid value for sf::BlendMode::Factor! Fallback to sf::BlendMode::Zero."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

sf::Uint32 factorToGlConstant(sf::BlendMode::Factor blendFactor)
        {
            switch (blendFactor)
            {
                case sf::BlendMode::Zero:             return GL_ZERO;
                case sf::BlendMode::One:              return GL_ONE;
                case sf::BlendMode::SrcColor:         return GL_SRC_COLOR;
                case sf::BlendMode::OneMinusSrcColor: return GL_ONE_MINUS_SRC_COLOR;
                case sf::BlendMode::DstColor:         return GL_DST_COLOR;
                case sf::BlendMode::OneMinusDstColor: return GL_ONE_MINUS_DST_COLOR;
                case sf::BlendMode::SrcAlpha:         return GL_SRC_ALPHA;
                case sf::BlendMode::OneMinusSrcAlpha: return GL_ONE_MINUS_SRC_ALPHA;
                case sf::BlendMode::DstAlpha:         return GL_DST_ALPHA;
                case sf::BlendMode::OneMinusDstAlpha: return GL_ONE_MINUS_DST_ALPHA;
            }

            sf::err() << "Invalid value for sf::BlendMode::Factor! Fallback to sf::BlendMode::Zero." << std::endl;
            assert(false);
            return GL_ZERO;
        }